

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr.cpp
# Opt level: O2

void __thiscall unodb::detail::qsbr_epoch::dump(qsbr_epoch *this,ostream *os)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"epoch = ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  assert_invariant(this);
  return;
}

Assistant:

[[gnu::cold]] UNODB_DETAIL_NOINLINE void detail::qsbr_epoch::dump(
    std::ostream &os) const {
  os << "epoch = " << static_cast<std::uint64_t>(epoch_val);
#ifndef NDEBUG
  assert_invariant();
#endif
}